

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O3

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::Fasttrack(Fasttrack<std::shared_mutex> *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  (this->super_Detector)._vptr_Detector = (_func_int **)&PTR_init_0011dbb0;
  lVar2 = 0;
  do {
    *(undefined1 **)
     ((long)&(this->allocs).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             .sets_._M_elems[0].set_.ctrl_ + lVar2) =
         phmap::container_internal::EmptyGroup()::empty_group;
    *(undefined8 *)
     ((long)&(this->allocs).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             .sets_._M_elems[0].set_.settings_ + lVar2) = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->allocs).
                     super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     .sets_._M_elems[0].set_.slots_ + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)&(this->allocs).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             .sets_._M_elems[0].set_.capacity_ + lVar2) = 0;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x400);
  lVar2 = 0;
  do {
    *(undefined1 **)
     ((long)&(this->vars).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
             .sets_._M_elems[0].set_.ctrl_ + lVar2) =
         phmap::container_internal::EmptyGroup()::empty_group;
    *(undefined8 *)
     ((long)&(this->vars).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
             .sets_._M_elems[0].set_.settings_ + lVar2) = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->vars).
                     super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                     .sets_._M_elems[0].set_.slots_ + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)&(this->vars).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
             .sets_._M_elems[0].set_.capacity_ + lVar2) = 0;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x400);
  (this->locks).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .ctrl_ = phmap::container_internal::EmptyGroup()::empty_group;
  (this->locks).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_0UL,_false>
  .value = 0;
  (this->locks).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .slots_ = (slot_type *)0x0;
  (this->locks).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .size_ = 0;
  (this->locks).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  .capacity_ = 0;
  (this->threads).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .ctrl_ = phmap::container_internal::EmptyGroup()::empty_group;
  (this->threads).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .settings_.
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>,_0UL,_false>
  .value = 0;
  (this->threads).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .slots_ = (slot_type *)0x0;
  (this->threads).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .size_ = 0;
  (this->threads).
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  .capacity_ = 0;
  lVar2 = 0;
  do {
    *(undefined1 **)
     ((long)&(this->happens_states).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .sets_._M_elems[0].set_.ctrl_ + lVar2) =
         phmap::container_internal::EmptyGroup()::empty_group;
    *(undefined8 *)
     ((long)&(this->happens_states).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .sets_._M_elems[0].set_.settings_ + lVar2) = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->happens_states).
                     super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                     .sets_._M_elems[0].set_.slots_ + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)&(this->happens_states).
             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .sets_._M_elems[0].set_.capacity_ + lVar2) = 0;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x400);
  this->log_flag = false;
  (this->log_count).read_ex_same_epoch = 0;
  (this->log_count).read_sh_same_epoch = 0;
  (this->log_count).read_shared = 0;
  (this->log_count).read_exclusive = 0;
  (this->log_count).read_share = 0;
  (this->log_count).write_same_epoch = 0;
  (this->log_count).write_exclusive = 0;
  (this->log_count).write_shared = 0;
  (this->g_lock)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->g_lock)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->g_lock)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->g_lock)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->g_lock)._M_impl._M_rwlock + 0x20) = 0;
  (this->g_lock)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->g_lock)._M_impl._M_rwlock.__data.__pad2 + 1) = 0;
  *(undefined8 *)((long)&(this->g_lock)._M_impl._M_rwlock + 0x31) = 0;
  return;
}

Assistant:

explicit Fasttrack() = default;